

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback.cpp
# Opt level: O0

int fooid(double *v)

{
  ostream *poVar1;
  runtime_error *this;
  double *in_RDI;
  ostringstream oss;
  string local_1b0 [48];
  ostringstream local_180 [384];
  
  if ((*in_RDI == 10.0) && (!NAN(*in_RDI))) {
    fooid_called = true;
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar1 = std::operator<<((ostream *)local_180,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1a);
  std::operator<<(poVar1," v==10.0");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_1b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int fooid(double const &v)
{
	TEST(v==10.0);
	fooid_called = true;
	return 0;
}